

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O0

void __thiscall Snake::Snake(Snake *this,Point *p,Point *dir)

{
  Head *this_00;
  Head *local_38 [3];
  Point *local_20;
  Point *dir_local;
  Point *p_local;
  Snake *this_local;
  
  local_20 = dir;
  dir_local = p;
  p_local = (Point *)this;
  std::vector<Object_*,_std::allocator<Object_*>_>::vector(&this->body);
  this->alive = true;
  this_00 = (Head *)operator_new(0x20);
  Head::Head(this_00,dir_local,local_20);
  this->head = this_00;
  this->tail = &this->head->super_Object;
  local_38[0] = this->head;
  std::vector<Object_*,_std::allocator<Object_*>_>::push_back(&this->body,(value_type *)local_38);
  return;
}

Assistant:

Snake::Snake(const Point& p, const Point& dir){
	alive = true;
	head = new Head(p, dir);
	tail = head;
	body.push_back(head);
}